

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost_mgm128_decrypt(mgm128_context *ctx,uchar *in,uchar *out,size_t len)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  code *pcVar4;
  code *pcVar5;
  ulong uVar6;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  byte *in_RDI;
  uint8_t c;
  int bl;
  void *key;
  mul128_f mul_gf;
  block128_f block;
  uint64_t mlen;
  uint64_t alen;
  uint mres;
  uint n;
  size_t i;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar7;
  grasshopper_w128_t *result;
  uint local_38;
  uint local_34;
  ulong local_30;
  int local_4;
  
  lVar2 = *(long *)(in_RDI + 0x50);
  lVar3 = *(long *)(in_RDI + 0x58);
  pcVar4 = *(code **)(in_RDI + 0xa8);
  pcVar5 = *(code **)(in_RDI + 0xb0);
  result = *(grasshopper_w128_t **)(in_RDI + 0xc0);
  uVar7 = *(uint *)(in_RDI + 0xb8);
  if (lVar3 == 0) {
    *in_RDI = *in_RDI & 0x7f;
    (*pcVar4)(in_RDI,in_RDI + 0x10,result);
  }
  uVar6 = in_RCX + lVar3;
  if ((((ulong)(1L << ((char)(uVar7 << 2) - 3U & 0x3f)) < uVar6) || (uVar6 < in_RCX)) ||
     ((ulong)(1L << ((char)(uVar7 << 2) - 3U & 0x3f)) < uVar6 + lVar2)) {
    ERR_GOST_error((int)((ulong)result >> 0x20),(int)result,
                   (char *)CONCAT44(uVar7,in_stack_ffffffffffffff98),0);
    local_4 = -1;
  }
  else {
    *(ulong *)(in_RDI + 0x58) = uVar6;
    local_38 = *(uint *)(in_RDI + 0xa0);
    if (*(int *)(in_RDI + 0xa4) != 0) {
      memset(in_RDI + (ulong)*(uint *)(in_RDI + 0xa4) + 0x60,0,
             (ulong)(uVar7 - *(int *)(in_RDI + 0xa4)));
      (*pcVar4)(in_RDI + 0x20,in_RDI + 0x40,result);
      (*pcVar5)(in_RDI + 0x70,in_RDI + 0x40,in_RDI + 0x60);
      grasshopper_plus128(result,(grasshopper_w128_t *)CONCAT44(uVar7,in_stack_ffffffffffffff98),
                          (grasshopper_w128_t *)0x121c55);
      inc_counter(in_RDI + 0x20,(long)((int)uVar7 / 2));
      in_RDI[0xa4] = 0;
      in_RDI[0xa5] = 0;
      in_RDI[0xa6] = 0;
      in_RDI[0xa7] = 0;
    }
    local_34 = local_38 % uVar7;
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (local_34 == 0) {
        (*pcVar4)(in_RDI + 0x10,in_RDI + 0x30,result);
        inc_counter(in_RDI + (long)((int)uVar7 / 2) + 0x10,(long)((int)uVar7 / 2));
      }
      bVar1 = *(byte *)(in_RSI + local_30);
      in_stack_ffffffffffffff98 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff98);
      in_RDI[(ulong)local_34 + 0x60] = bVar1;
      *(byte *)(in_RDX + local_30) = bVar1 ^ in_RDI[(ulong)local_34 + 0x30];
      local_38 = (local_34 + 1) % uVar7;
      if (local_38 == 0) {
        (*pcVar4)(in_RDI + 0x20,in_RDI + 0x40,result);
        (*pcVar5)(in_RDI + 0x70,in_RDI + 0x40,in_RDI + 0x60);
        grasshopper_plus128(result,(grasshopper_w128_t *)CONCAT44(uVar7,in_stack_ffffffffffffff98),
                            (grasshopper_w128_t *)0x121dc3);
        inc_counter(in_RDI + 0x20,(long)((int)uVar7 / 2));
      }
      local_34 = local_38;
    }
    *(uint *)(in_RDI + 0xa0) = local_38;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int gost_mgm128_decrypt(mgm128_context *ctx, const unsigned char *in,
                          unsigned char *out, size_t len)
{
    size_t i;
    unsigned int n, mres;
    uint64_t alen = ctx->len.u[0];
    uint64_t mlen = ctx->len.u[1];
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (mlen == 0) {
        ctx->nonce.c[0] &= 0x7f;
        (*block) (ctx->nonce.c, ctx->Yi.c, key);  // Y_1 = E_K(0 || nonce)
    }

    mlen += len;
    if (mlen > ((ossl_uintmax_t)(1) << (bl * 4 - 3)) ||     // < 2^(n/2)  (len stores in bytes)
        (sizeof(len) == 8 && mlen < len) ||
        (mlen + alen) > ((ossl_uintmax_t)(1) << (bl * 4 - 3))) {
            GOSTerr(GOST_F_GOST_MGM128_DECRYPT,
                    GOST_R_DATA_TOO_LARGE);
            return -1;
        }
    ctx->len.u[1] = mlen;

    mres = ctx->mres;

    if (ctx->ares) {
        /* First call to encrypt finalizes AAD */
        memset(ctx->ACi.c + ctx->ares, 0, bl - ctx->ares);
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) A_i
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)

        ctx->ares = 0;
    }

    n = mres % bl;
    // TODO: replace with full blocks processing
    for (i = 0; i < len; ++i) {
        uint8_t c;
        if (n == 0) {
            (*block) (ctx->Yi.c, ctx->EKi.c, key);      // E_K(Y_i)
            inc_counter(ctx->Yi.c + bl / 2, bl / 2);    // Y_i = incr_r(Y_{i-1})
        }
        ctx->ACi.c[n] = c = in[i];
        out[i] = c ^ ctx->EKi.c[n];             // P_i = C_i (xor) E_K(Y_i)
        mres = n = (n + 1) % bl;
        if (n == 0) {
            (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
            mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) C_i
            grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
                (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
            inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)
        }
    }

    ctx->mres = mres;
    return 0;
}